

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

uint64_t LD_AwareHash(uchar *data,uint64_t n,uint64_t hash,uint64_t scale,uint64_t hardener)

{
  uint64_t uVar1;
  
  if (n != 0) {
    uVar1 = 0;
    do {
      hash = hash * scale + (ulong)data[uVar1];
      uVar1 = uVar1 + 1;
    } while (n != uVar1);
  }
  return hash ^ hardener;
}

Assistant:

uint64_t LD_AwareHash(unsigned char* data, uint64_t n,
	uint64_t hash, uint64_t scale, uint64_t hardener) {
	while (n) {
		hash *= scale;
		hash += *data++;
		n--;
	}
	return hash ^ hardener;
}